

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.h
# Opt level: O1

string * __thiscall
cmExtraSublimeTextGenerator::GetName_abi_cxx11_(cmExtraSublimeTextGenerator *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x20656d696c627553;
  *(undefined8 *)((long)&in_RDI->field_2 + 6) = 0x3220747865542065;
  in_RDI->_M_string_length = 0xe;
  (in_RDI->field_2)._M_local_buf[0xe] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string GetName() const
                        { return cmExtraSublimeTextGenerator::GetActualName();}